

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

ostream * Catch::operator<<(ostream *os,SourceLineInfo *info)

{
  ostream *poVar1;
  
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,(info->file)._M_dataplus._M_p,(info->file)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,":",1);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  return os;
}

Assistant:

std::ostream& operator << (std::ostream& os, SourceLineInfo const& info) {
#ifndef __GNUG__
		os << info.file << "(" << info.line << ")";
#else
		os << info.file << ":" << info.line;
#endif
		return os;
	}